

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error SW_FT_Stroker_BeginSubPath(SW_FT_Stroker stroker,SW_FT_Vector *to,SW_FT_Bool open)

{
  SW_FT_Pos SVar1;
  bool bVar2;
  
  stroker->first_point = '\x01';
  SVar1 = to->y;
  (stroker->center).x = to->x;
  (stroker->center).y = SVar1;
  stroker->subpath_open = open;
  bVar2 = true;
  if (stroker->line_join == SW_FT_STROKER_LINEJOIN_ROUND) {
    if (open == '\0') {
      bVar2 = false;
    }
    else {
      bVar2 = stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT;
    }
  }
  stroker->handle_wide_strokes = bVar2;
  SVar1 = to->y;
  (stroker->subpath_start).x = to->x;
  (stroker->subpath_start).y = SVar1;
  stroker->angle_in = 0;
  return 0;
}

Assistant:

SW_FT_Error SW_FT_Stroker_BeginSubPath(SW_FT_Stroker stroker, SW_FT_Vector* to,
                                       SW_FT_Bool open)
{
    /* We cannot process the first point, because there is not enough      */
    /* information regarding its corner/cap.  The latter will be processed */
    /* in the `SW_FT_Stroker_EndSubPath' routine.                             */
    /*                                                                     */
    stroker->first_point = TRUE;
    stroker->center = *to;
    stroker->subpath_open = open;

    /* Determine if we need to check whether the border radius is greater */
    /* than the radius of curvature of a curve, to handle this case       */
    /* specially.  This is only required if bevel joins or butt caps may  */
    /* be created, because round & miter joins and round & square caps    */
    /* cover the negative sector created with wide strokes.               */
    stroker->handle_wide_strokes =
        SW_FT_BOOL(stroker->line_join != SW_FT_STROKER_LINEJOIN_ROUND ||
                   (stroker->subpath_open &&
                    stroker->line_cap == SW_FT_STROKER_LINECAP_BUTT));

    /* record the subpath start point for each border */
    stroker->subpath_start = *to;

    stroker->angle_in = 0;

    return 0;
}